

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

bool __thiscall
TPZMatrix<std::complex<long_double>_>::SolveEigensystemJacobi
          (TPZMatrix<std::complex<long_double>_> *this,int64_t *numiterations,REAL *tol,
          TPZVec<std::complex<long_double>_> *Eigenvalues,
          TPZFMatrix<std::complex<long_double>_> *Eigenvectors)

{
  double dVar1;
  undefined8 uVar2;
  complex<long_double> val_00;
  complex<long_double> tol_00;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  int iVar6;
  complex<long_double> *pcVar7;
  complex<long_double> *pcVar8;
  TPZVec<std::complex<long_double>_> *in_RCX;
  double *in_RDX;
  long *in_RSI;
  TPZBaseMatrix *in_RDI;
  long *in_R8;
  longdouble in_ST0;
  longdouble lVar9;
  longdouble lVar10;
  longdouble lVar11;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar12;
  longdouble lVar13;
  longdouble lVar14;
  complex<long_double> val;
  int64_t i_9;
  complex<long_double> exp_1;
  int64_t i_8;
  int64_t i_7;
  REAL norm2;
  int64_t i_6;
  double difTemp;
  double dif;
  int64_t count;
  int64_t i_5;
  int64_t i_4;
  REAL norm1;
  int64_t i_3;
  int64_t i_2;
  complex<long_double> exp;
  complex<long_double> answ;
  TPZFNMatrix<9,_std::complex<long_double>_> Matrix_1;
  int64_t i_1;
  int64_t eigen;
  TPZFNMatrix<3,_std::complex<long_double>_> VecIni_cp;
  TPZFNMatrix<3,_std::complex<long_double>_> VecIni;
  bool result;
  int64_t j;
  int64_t i;
  TPZFNMatrix<9,_std::complex<long_double>_> Matrix;
  int64_t size;
  REAL tolerance;
  int64_t NumIt;
  TPZVec<std::complex<long_double>_> *in_stack_fffffffffffff2a8;
  undefined2 in_stack_fffffffffffff2b0;
  undefined2 uVar15;
  undefined2 uVar16;
  undefined6 in_stack_fffffffffffff2b2;
  int64_t *in_stack_fffffffffffff2b8;
  TPZFMatrix<std::complex<long_double>_> *B;
  undefined2 in_stack_fffffffffffff2c0;
  undefined6 in_stack_fffffffffffff2c2;
  int64_t in_stack_fffffffffffff2c8;
  TPZFMatrix<std::complex<long_double>_> *in_stack_fffffffffffff2d0;
  int64_t in_stack_fffffffffffff300;
  undefined4 in_stack_fffffffffffff308;
  undefined4 in_stack_fffffffffffff30c;
  undefined6 in_stack_fffffffffffff310;
  undefined2 in_stack_fffffffffffff316;
  complex<long_double> *in_stack_fffffffffffff328;
  int64_t in_stack_fffffffffffff330;
  int64_t in_stack_fffffffffffff338;
  TPZFNMatrix<3,_std::complex<long_double>_> *in_stack_fffffffffffff340;
  undefined4 local_c9c;
  undefined6 in_stack_fffffffffffff368;
  undefined2 in_stack_fffffffffffff36e;
  TPZFMatrix<std::complex<long_double>_> *in_stack_fffffffffffff370;
  double local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  TPZVec<std::complex<long_double>_> *in_stack_fffffffffffff4d0;
  long in_stack_fffffffffffff4e0;
  double in_stack_fffffffffffff4e8;
  undefined8 in_stack_fffffffffffff4f0;
  TPZFMatrix<std::complex<long_double>_> *in_stack_fffffffffffff4f8;
  undefined8 in_stack_fffffffffffff500;
  undefined1 in_stack_fffffffffffff508 [24];
  double local_ab8;
  undefined8 uStack_ab0;
  TPZFMatrix<std::complex<long_double>_> *local_aa8;
  undefined8 uStack_aa0;
  complex<long_double> local_a98;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  long local_a50;
  double local_a48;
  undefined8 uStack_a40;
  TPZFMatrix<std::complex<long_double>_> *local_a38;
  undefined8 uStack_a30;
  _func_int **local_a28;
  int64_t iStack_a20;
  int64_t local_a18;
  undefined8 uStack_a10;
  long local_a08;
  double local_a00;
  long local_9f8;
  double local_9f0;
  double local_9e8;
  long local_9e0;
  complex<long_double> local_9d8;
  undefined8 local_9b8;
  undefined8 local_9b0;
  undefined8 local_9a8;
  undefined8 local_9a0;
  long local_990;
  double local_988;
  undefined8 uStack_980;
  TPZFMatrix<std::complex<long_double>_> *local_978;
  undefined8 uStack_970;
  double local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  long local_948;
  double local_940;
  complex<long_double> local_938 [2];
  undefined1 local_8f8 [72];
  long local_8b0;
  double local_8a8;
  undefined8 uStack_8a0;
  TPZFMatrix<std::complex<long_double>_> *local_898;
  undefined8 uStack_890;
  complex<long_double> local_888 [2];
  undefined1 local_848 [72];
  long local_800;
  double local_7f8;
  undefined8 uStack_7f0;
  TPZFMatrix<std::complex<long_double>_> *local_7e8;
  undefined8 uStack_7e0;
  double local_7d8;
  undefined8 uStack_7d0;
  TPZFMatrix<std::complex<long_double>_> *local_7c8;
  undefined8 uStack_7c0;
  undefined1 local_7b8 [32];
  complex<long_double> *local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  complex<long_double> local_4f8;
  long local_4d8;
  long local_4d0;
  complex<long_double> local_4c8 [9];
  complex<long_double> local_398 [9];
  undefined4 local_25c;
  undefined1 local_255;
  undefined8 local_248;
  undefined8 local_240;
  undefined8 local_238;
  undefined8 local_230;
  long local_228;
  long local_220;
  int64_t local_48;
  double local_40;
  long local_38;
  long *local_30;
  TPZVec<std::complex<long_double>_> *local_28;
  byte local_1;
  
  local_38 = *in_RSI;
  local_40 = *in_RDX;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_48 = TPZBaseMatrix::Rows(in_RDI);
  TPZFNMatrix<9,_std::complex<long_double>_>::TPZFNMatrix
            ((TPZFNMatrix<9,_std::complex<long_double>_> *)
             CONCAT26(in_stack_fffffffffffff316,in_stack_fffffffffffff310),
             CONCAT44(in_stack_fffffffffffff30c,in_stack_fffffffffffff308),in_stack_fffffffffffff300
            );
  for (local_220 = 0; local_220 < local_48; local_220 = local_220 + 1) {
    for (local_228 = 0; local_228 < local_48; local_228 = local_228 + 1) {
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(&local_248,in_RDI,local_220,local_228);
      pcVar7 = TPZFMatrix<std::complex<long_double>_>::operator()
                         (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,
                          CONCAT62(in_stack_fffffffffffff2c2,in_stack_fffffffffffff2c0));
      *(undefined8 *)pcVar7->_M_value = local_248;
      *(undefined8 *)(pcVar7->_M_value + 8) = local_240;
      *(undefined8 *)(pcVar7->_M_value + 0x10) = local_238;
      *(undefined8 *)(pcVar7->_M_value + 0x18) = local_230;
    }
  }
  local_255 = SolveEigenvaluesJacobi
                        ((TPZMatrix<std::complex<long_double>_> *)
                         CONCAT62(in_stack_fffffffffffff2c2,in_stack_fffffffffffff2c0),
                         in_stack_fffffffffffff2b8,
                         (REAL *)CONCAT62(in_stack_fffffffffffff2b2,in_stack_fffffffffffff2b0),
                         in_stack_fffffffffffff2a8);
  if ((bool)local_255) {
    std::complex<long_double>::complex(local_398,(longdouble)0,(longdouble)0);
    TPZFNMatrix<3,_std::complex<long_double>_>::TPZFNMatrix
              (in_stack_fffffffffffff340,in_stack_fffffffffffff338,in_stack_fffffffffffff330,
               in_stack_fffffffffffff328);
    lVar12 = in_ST5;
    std::complex<long_double>::complex(local_4c8,(longdouble)0,(longdouble)0);
    TPZFNMatrix<3,_std::complex<long_double>_>::TPZFNMatrix
              (in_stack_fffffffffffff340,in_stack_fffffffffffff338,in_stack_fffffffffffff330,
               in_stack_fffffffffffff328);
    (**(code **)(*local_30 + 0x68))(local_30,local_48);
    (**(code **)(*local_30 + 0x78))();
    for (local_4d0 = 0; local_4d0 < local_48; local_4d0 = local_4d0 + 1) {
      lVar11 = lVar12;
      for (local_4d8 = 0; local_4d8 < local_48; local_4d8 = local_4d8 + 1) {
        iVar6 = rand();
        lVar12 = (longdouble)0;
        pcVar7 = SUB108(lVar12,0);
        uVar16 = (undefined2)((unkuint10)lVar12 >> 0x40);
        lVar11 = in_ST5;
        std::complex<long_double>::complex(&local_4f8,(longdouble)iVar6,lVar12);
        TPZFMatrix<std::complex<long_double>_>::PutVal
                  (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,
                   CONCAT62(in_stack_fffffffffffff2c2,uVar16),pcVar7);
      }
      TPZFMatrix<std::complex<long_double>_>::TPZFMatrix
                (in_stack_fffffffffffff370,
                 (TPZMatrix<std::complex<long_double>_> *)
                 CONCAT26(in_stack_fffffffffffff36e,in_stack_fffffffffffff368));
      TPZFNMatrix<9,_std::complex<long_double>_>::TPZFNMatrix
                ((TPZFNMatrix<9,_std::complex<long_double>_> *)
                 CONCAT26(in_stack_fffffffffffff316,in_stack_fffffffffffff310),
                 (TPZFMatrix<std::complex<long_double>_> *)
                 CONCAT44(in_stack_fffffffffffff30c,in_stack_fffffffffffff308));
      TPZFMatrix<std::complex<long_double>_>::~TPZFMatrix
                ((TPZFMatrix<std::complex<long_double>_> *)0x12c1e3f);
      pcVar7 = TPZVec<std::complex<long_double>_>::operator[](local_28,local_4d0);
      local_798 = *(complex<long_double> **)pcVar7->_M_value;
      uStack_790 = *(undefined8 *)(pcVar7->_M_value + 8);
      local_788 = *(undefined8 *)(pcVar7->_M_value + 0x10);
      uStack_780 = *(undefined8 *)(pcVar7->_M_value + 0x18);
      lVar12 = lVar11;
      std::complex<long_double>::complex
                ((complex<long_double> *)local_7b8,(longdouble)1e-05,(longdouble)0);
      uVar16 = (undefined2)uStack_790;
      uVar2._2_6_ = (undefined6)((ulong)uStack_790 >> 0x10);
      val_00._M_value._8_8_ = in_stack_fffffffffffff4e8;
      val_00._M_value._0_8_ = in_stack_fffffffffffff4e0;
      val_00._M_value._16_8_ = in_stack_fffffffffffff4f0;
      val_00._M_value._24_8_ = in_stack_fffffffffffff4f8;
      tol_00._M_value._8_24_ = in_stack_fffffffffffff508;
      tol_00._M_value._0_8_ = in_stack_fffffffffffff500;
      pcVar7 = local_798;
      in_stack_fffffffffffff2c8 = local_7b8._0_8_;
      in_stack_fffffffffffff2d0 = (TPZFMatrix<std::complex<long_double>_> *)local_7b8._8_8_;
      ReturnNearestValue(val_00,in_stack_fffffffffffff4d0,tol_00);
      TPZVec<std::complex<long_double>_>::operator[](local_28,local_4d0);
      std::operator-((complex<long_double> *)CONCAT62(uVar2._2_6_,uVar16),pcVar7);
      local_7e8 = local_7c8;
      uStack_7e0 = uStack_7c0;
      local_7f8 = local_7d8;
      uStack_7f0 = uStack_7d0;
      uVar16 = (undefined2)uStack_7c0;
      in_stack_fffffffffffff2c2 = (undefined6)((ulong)uStack_7c0 >> 0x10);
      uVar2._2_6_ = (undefined6)((ulong)uStack_7d0 >> 0x10);
      B = local_7c8;
      fabs(local_7d8);
      lVar13 = lVar12;
      if ((double)in_ST0 <= 1e-05) {
        for (local_8b0 = 0; local_8b0 < local_48; local_8b0 = local_8b0 + 1) {
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_8f8,in_RDI,local_8b0);
          TPZVec<std::complex<long_double>_>::operator[](local_28,local_4d0);
          lVar10 = (longdouble)0;
          B = SUB108(lVar10,0);
          uVar16 = (undefined2)((unkuint10)lVar10 >> 0x40);
          lVar9 = (longdouble)0.01;
          pcVar7 = SUB108(lVar9,0);
          uVar15 = (undefined2)((unkuint10)lVar9 >> 0x40);
          lVar13 = lVar12;
          std::complex<long_double>::complex(local_938,lVar9,lVar10);
          std::operator-((complex<long_double> *)CONCAT62(uVar2._2_6_,uVar15),pcVar7);
          std::operator-((complex<long_double> *)CONCAT62(uVar2._2_6_,uVar15),pcVar7);
          TPZFMatrix<std::complex<long_double>_>::PutVal
                    (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,
                     CONCAT62(in_stack_fffffffffffff2c2,uVar16),(complex<long_double> *)B);
        }
      }
      else {
        for (local_800 = 0; local_800 < local_48; local_800 = local_800 + 1) {
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(local_848,in_RDI,local_800);
          TPZVec<std::complex<long_double>_>::operator[](local_28,local_4d0);
          local_898 = local_7c8;
          uStack_890 = uStack_7c0;
          local_8a8 = local_7d8;
          uStack_8a0 = uStack_7d0;
          in_stack_fffffffffffff2c2 = (undefined6)((ulong)uStack_7c0 >> 0x10);
          uVar2._2_6_ = (undefined6)((ulong)uStack_7d0 >> 0x10);
          fabs(local_7d8);
          in_ST1 = (longdouble)0.01 * in_ST1;
          lVar10 = (longdouble)0;
          B = SUB108(lVar10,0);
          uVar16 = (undefined2)((unkuint10)lVar10 >> 0x40);
          pcVar7 = SUB108(in_ST1,0);
          uVar15 = (undefined2)((unkuint10)in_ST1 >> 0x40);
          lVar9 = lVar12;
          lVar13 = lVar12;
          std::complex<long_double>::complex(local_888,in_ST1,lVar10);
          std::operator-((complex<long_double> *)CONCAT62(uVar2._2_6_,uVar15),pcVar7);
          std::operator-((complex<long_double> *)CONCAT62(uVar2._2_6_,uVar15),pcVar7);
          TPZFMatrix<std::complex<long_double>_>::PutVal
                    (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,
                     CONCAT62(in_stack_fffffffffffff2c2,uVar16),(complex<long_double> *)B);
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = in_ST4;
          in_ST4 = in_ST5;
          in_ST5 = lVar11;
          lVar11 = lVar12;
          lVar12 = lVar9;
        }
      }
      local_940 = 0.0;
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = lVar11;
      for (local_948 = 0; local_948 < local_48; local_948 = local_948 + 1) {
        pcVar7 = TPZFMatrix<std::complex<long_double>_>::operator()
                           (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,
                            CONCAT62(in_stack_fffffffffffff2c2,uVar16));
        local_968 = *(double *)pcVar7->_M_value;
        uStack_960 = *(undefined8 *)(pcVar7->_M_value + 8);
        local_958 = *(undefined8 *)(pcVar7->_M_value + 0x10);
        uStack_950 = *(undefined8 *)(pcVar7->_M_value + 0x18);
        uVar16 = (undefined2)uStack_950;
        uVar2._2_6_ = (undefined6)((ulong)uStack_950 >> 0x10);
        fabs(local_968);
        pcVar7 = TPZFMatrix<std::complex<long_double>_>::operator()
                           (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,
                            CONCAT62(uVar2._2_6_,uVar16));
        local_988 = *(double *)pcVar7->_M_value;
        uStack_980 = *(undefined8 *)(pcVar7->_M_value + 8);
        B = *(TPZFMatrix<std::complex<long_double>_> **)(pcVar7->_M_value + 0x10);
        uStack_970 = *(undefined8 *)(pcVar7->_M_value + 0x18);
        uVar16 = (undefined2)uStack_970;
        in_stack_fffffffffffff2c2 = (undefined6)((ulong)uStack_970 >> 0x10);
        uVar2._2_6_ = (undefined6)((ulong)uStack_980 >> 0x10);
        local_978 = B;
        fabs(local_988);
        local_940 = (double)(in_ST0 * in_ST1 + (longdouble)local_940);
        in_ST0 = in_ST2;
        in_ST1 = in_ST3;
        in_ST2 = in_ST4;
        in_ST3 = in_ST5;
        in_ST4 = lVar12;
        in_ST5 = lVar12;
        lVar13 = lVar12;
      }
      local_940 = sqrt(local_940);
      for (local_990 = 0; local_990 < local_48; local_990 = local_990 + 1) {
        TPZFMatrix<std::complex<long_double>_>::operator()
                  (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,
                   CONCAT62(in_stack_fffffffffffff2c2,uVar16));
        lVar10 = (longdouble)local_940;
        lVar11 = (longdouble)0;
        B = SUB108(lVar11,0);
        uVar16 = (undefined2)((unkuint10)lVar11 >> 0x40);
        pcVar7 = SUB108(lVar10,0);
        uVar15 = (undefined2)((unkuint10)lVar10 >> 0x40);
        lVar12 = in_ST5;
        lVar13 = in_ST5;
        std::complex<long_double>::complex(&local_9d8,lVar10,lVar11);
        std::operator/((complex<long_double> *)CONCAT62(uVar2._2_6_,uVar15),pcVar7);
        pcVar7 = TPZFMatrix<std::complex<long_double>_>::operator()
                           (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,
                            CONCAT62(in_stack_fffffffffffff2c2,uVar16));
        *(undefined8 *)pcVar7->_M_value = local_9b8;
        *(undefined8 *)(pcVar7->_M_value + 8) = local_9b0;
        *(undefined8 *)(pcVar7->_M_value + 0x10) = local_9a8;
        *(undefined8 *)(pcVar7->_M_value + 0x18) = local_9a0;
      }
      local_9e8 = 10.0;
      local_9f0 = 0.0;
      for (local_9e0 = 0; local_40 < local_9e8 && local_9e0 <= local_38; local_9e0 = local_9e0 + 1)
      {
        for (local_9f8 = 0; local_9f8 < local_48; local_9f8 = local_9f8 + 1) {
          pcVar7 = TPZFMatrix<std::complex<long_double>_>::operator()
                             (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,
                              CONCAT62(in_stack_fffffffffffff2c2,uVar16));
          pcVar8 = TPZFMatrix<std::complex<long_double>_>::operator()
                             (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,
                              CONCAT62(in_stack_fffffffffffff2c2,uVar16));
          *(undefined8 *)pcVar8->_M_value = *(undefined8 *)pcVar7->_M_value;
          *(undefined8 *)(pcVar8->_M_value + 8) = *(undefined8 *)(pcVar7->_M_value + 8);
          *(undefined8 *)(pcVar8->_M_value + 0x10) = *(undefined8 *)(pcVar7->_M_value + 0x10);
          *(undefined8 *)(pcVar8->_M_value + 0x18) = *(undefined8 *)(pcVar7->_M_value + 0x18);
        }
        Solve_LU((TPZMatrix<std::complex<long_double>_> *)CONCAT62(in_stack_fffffffffffff2c2,uVar16)
                 ,B);
        local_a00 = 0.0;
        for (local_a08 = 0; local_a08 < local_48; local_a08 = local_a08 + 1) {
          in_stack_fffffffffffff370 =
               (TPZFMatrix<std::complex<long_double>_> *)
               TPZFMatrix<std::complex<long_double>_>::operator()
                         (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,
                          CONCAT62(in_stack_fffffffffffff2c2,uVar16));
          local_a28 = (in_stack_fffffffffffff370->super_TPZMatrix<std::complex<long_double>_>).
                      super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable;
          iStack_a20 = (in_stack_fffffffffffff370->super_TPZMatrix<std::complex<long_double>_>).
                       super_TPZBaseMatrix.fRow;
          local_a18 = (in_stack_fffffffffffff370->super_TPZMatrix<std::complex<long_double>_>).
                      super_TPZBaseMatrix.fCol;
          uVar2._0_1_ = (in_stack_fffffffffffff370->super_TPZMatrix<std::complex<long_double>_>).
                        super_TPZBaseMatrix.fDecomposed;
          uVar2._1_1_ = (in_stack_fffffffffffff370->super_TPZMatrix<std::complex<long_double>_>).
                        super_TPZBaseMatrix.fDefPositive;
          uVar2._2_6_ = *(undefined6 *)
                         &(in_stack_fffffffffffff370->super_TPZMatrix<std::complex<long_double>_>).
                          super_TPZBaseMatrix.field_0x1a;
          uVar16 = (undefined2)uVar2;
          uStack_a10 = uVar2;
          fabs((double)local_a28);
          local_c9c = SUB104(in_ST0,0);
          in_stack_fffffffffffff368 = (undefined6)((unkuint10)in_ST0 >> 0x20);
          pcVar7 = TPZFMatrix<std::complex<long_double>_>::operator()
                             (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,
                              CONCAT62(uVar2._2_6_,uVar16));
          local_a48 = *(double *)pcVar7->_M_value;
          uStack_a40 = *(undefined8 *)(pcVar7->_M_value + 8);
          B = *(TPZFMatrix<std::complex<long_double>_> **)(pcVar7->_M_value + 0x10);
          uStack_a30 = *(undefined8 *)(pcVar7->_M_value + 0x18);
          uVar16 = (undefined2)uStack_a30;
          in_stack_fffffffffffff2c2 = (undefined6)((ulong)uStack_a30 >> 0x10);
          uVar2._2_6_ = (undefined6)((ulong)uStack_a40 >> 0x10);
          in_ST0 = in_ST2;
          in_ST2 = in_ST4;
          in_ST4 = lVar12;
          local_a38 = B;
          fabs(local_a48);
          local_a00 = (double)((longdouble)CONCAT64(in_stack_fffffffffffff368,local_c9c) * in_ST1 +
                              (longdouble)local_a00);
          in_ST1 = in_ST3;
          in_ST3 = in_ST5;
          in_ST5 = in_ST4;
          lVar12 = in_ST4;
          lVar13 = in_ST4;
        }
        local_a00 = sqrt(local_a00);
        local_9f0 = 0.0;
        for (local_a50 = 0; local_a50 < local_48; local_a50 = local_a50 + 1) {
          TPZFMatrix<std::complex<long_double>_>::operator()
                    (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,
                     CONCAT62(in_stack_fffffffffffff2c2,uVar16));
          lVar11 = (longdouble)local_a00;
          uVar15 = (undefined2)((unkuint10)(longdouble)0 >> 0x40);
          pcVar8 = SUB108(lVar11,0);
          uVar16 = (undefined2)((unkuint10)lVar11 >> 0x40);
          lVar12 = in_ST5;
          std::complex<long_double>::complex(&local_a98,lVar11,(longdouble)0);
          std::operator/((complex<long_double> *)CONCAT62(uVar2._2_6_,uVar16),pcVar8);
          pcVar7 = TPZFMatrix<std::complex<long_double>_>::operator()
                             (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,
                              CONCAT62(in_stack_fffffffffffff2c2,uVar15));
          *(undefined8 *)(pcVar7->_M_value + 0x10) = local_a68;
          *(undefined8 *)(pcVar7->_M_value + 0x18) = uStack_a60;
          *(undefined8 *)pcVar7->_M_value = local_a78;
          *(undefined8 *)(pcVar7->_M_value + 8) = uStack_a70;
          TPZFMatrix<std::complex<long_double>_>::operator()
                    (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,
                     CONCAT62(in_stack_fffffffffffff2c2,uVar15));
          TPZFMatrix<std::complex<long_double>_>::operator()
                    (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,
                     CONCAT62(in_stack_fffffffffffff2c2,uVar15));
          std::operator-((complex<long_double> *)CONCAT62(uVar2._2_6_,uVar16),pcVar8);
          TPZFMatrix<std::complex<long_double>_>::operator()
                    (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,
                     CONCAT62(in_stack_fffffffffffff2c2,uVar15));
          TPZFMatrix<std::complex<long_double>_>::operator()
                    (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,
                     CONCAT62(in_stack_fffffffffffff2c2,uVar15));
          std::operator-((complex<long_double> *)CONCAT62(uVar2._2_6_,uVar16),pcVar8);
          std::operator*((complex<long_double> *)CONCAT62(uVar2._2_6_,uVar16),pcVar8);
          uVar16 = (undefined2)uStack_aa0;
          in_stack_fffffffffffff2c2 = (undefined6)((ulong)uStack_aa0 >> 0x10);
          uVar2._2_6_ = (undefined6)((ulong)uStack_ab0 >> 0x10);
          B = local_aa8;
          in_stack_fffffffffffff4e8 = local_ab8;
          in_stack_fffffffffffff4f0 = uStack_ab0;
          in_stack_fffffffffffff4f8 = local_aa8;
          in_stack_fffffffffffff500 = uStack_aa0;
          fabs(local_ab8);
          in_stack_fffffffffffff30c = SUB104(in_ST0,0);
          in_stack_fffffffffffff310 = (undefined6)((unkuint10)in_ST0 >> 0x20);
          local_9f0 = (double)((longdouble)local_9f0 + in_ST0);
          in_ST0 = in_ST1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = in_ST4;
          in_ST4 = in_ST5;
          in_ST5 = lVar12;
          lVar13 = lVar12;
        }
        local_9e8 = sqrt(local_9f0);
      }
      for (in_stack_fffffffffffff4e0 = 0; in_stack_fffffffffffff4e0 < local_48;
          in_stack_fffffffffffff4e0 = in_stack_fffffffffffff4e0 + 1) {
        pcVar7 = TPZFMatrix<std::complex<long_double>_>::operator()
                           (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,
                            CONCAT62(in_stack_fffffffffffff2c2,uVar16));
        local_b48 = *(double *)pcVar7->_M_value;
        uStack_b40 = *(undefined8 *)(pcVar7->_M_value + 8);
        local_b38 = *(undefined8 *)(pcVar7->_M_value + 0x10);
        in_stack_fffffffffffff4d0 =
             *(TPZVec<std::complex<long_double>_> **)(pcVar7->_M_value + 0x18);
        uVar16 = SUB82(in_stack_fffffffffffff4d0,0);
        in_stack_fffffffffffff2c2 = (undefined6)((ulong)in_stack_fffffffffffff4d0 >> 0x10);
        fabs(local_b48);
        dVar1 = (double)in_ST0;
        in_ST0 = in_ST1;
        lVar11 = in_ST2;
        lVar10 = in_ST3;
        lVar9 = in_ST4;
        lVar3 = in_ST5;
        lVar4 = lVar12;
        lVar5 = lVar13;
        if (dVar1 < 1e-05) {
          lVar14 = lVar13;
          std::complex<long_double>::operator=((complex<long_double> *)&local_b48,(longdouble)0);
          in_ST0 = in_ST1;
          lVar11 = in_ST2;
          lVar10 = in_ST3;
          lVar9 = in_ST4;
          lVar3 = in_ST5;
          lVar4 = lVar12;
          lVar5 = lVar13;
          lVar13 = lVar14;
        }
        lVar12 = lVar5;
        in_ST5 = lVar4;
        in_ST4 = lVar3;
        in_ST3 = lVar9;
        in_ST2 = lVar10;
        in_ST1 = lVar11;
        pcVar7 = TPZFMatrix<std::complex<long_double>_>::operator()
                           (in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8,
                            CONCAT62(in_stack_fffffffffffff2c2,uVar16));
        *(double *)pcVar7->_M_value = local_b48;
        *(undefined8 *)(pcVar7->_M_value + 8) = uStack_b40;
        *(undefined8 *)(pcVar7->_M_value + 0x10) = local_b38;
        *(TPZVec<std::complex<long_double>_> **)(pcVar7->_M_value + 0x18) =
             in_stack_fffffffffffff4d0;
      }
      TPZFNMatrix<9,_std::complex<long_double>_>::~TPZFNMatrix
                ((TPZFNMatrix<9,_std::complex<long_double>_> *)0x12c2b37);
    }
    local_1 = 1;
    local_25c = 1;
    TPZFNMatrix<3,_std::complex<long_double>_>::~TPZFNMatrix
              ((TPZFNMatrix<3,_std::complex<long_double>_> *)0x12c2b70);
    TPZFNMatrix<3,_std::complex<long_double>_>::~TPZFNMatrix
              ((TPZFNMatrix<3,_std::complex<long_double>_> *)0x12c2b7d);
  }
  else {
    local_1 = 0;
    local_25c = 1;
  }
  TPZFNMatrix<9,_std::complex<long_double>_>::~TPZFNMatrix
            ((TPZFNMatrix<9,_std::complex<long_double>_> *)0x12c2ba8);
  return (bool)(local_1 & 1);
}

Assistant:

bool TPZMatrix<TVar>::SolveEigensystemJacobi(int64_t &numiterations, REAL & tol, TPZVec<TVar> & Eigenvalues, TPZFMatrix<TVar> & Eigenvectors) const{
	
	int64_t NumIt = numiterations;
	REAL tolerance = tol;
	
#ifdef PZDEBUG2
	if (this->Rows() != this->Cols())
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. this->Rows = " << this->Rows() << " - this->Cols() = " << this->Cols() << endl;
		return false;
	}
	
	if (this->VerifySymmetry(1.e-8) == false)
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. This matrix is not symmetric." << endl;
		return false;
	}
#endif
	
	const int64_t size = this->Rows();
	
	/** Making a copy of this */
	TPZFNMatrix<9,TVar> Matrix(size,size); //fast constructor in case of this is a stress or strain tensor.
	for(int64_t i = 0; i < size; i++) for(int64_t j = 0; j < size; j++) Matrix(i,j) = this->Get(i,j);
	
	/** Compute Eigenvalues *//////////////////////////////////////
	bool result = Matrix.SolveEigenvaluesJacobi(numiterations, tol, &Eigenvalues);
	if (result == false) return false;
	
	/** Compute Eigenvectors *//////////////////////////////////////
	TPZFNMatrix<3, TVar> VecIni(size,1,0.), VecIni_cp(size,1,0.);
	
	Eigenvectors.Resize(size, size);
	Eigenvectors.Zero();
	for(int64_t eigen = 0; eigen < size; eigen++)
	{
        for(int64_t i = 0; i < size; i++) VecIni.PutVal(i,0,rand());
		
        TPZFNMatrix<9,TVar> Matrix(*this);
		
        TVar answ = ReturnNearestValue(Eigenvalues[eigen], Eigenvalues,((TVar)1.E-5));
        TVar exp = answ - Eigenvalues[eigen];
        if((REAL)(fabs(exp)) > 1.E-5)
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (TVar)(Eigenvalues[eigen] - (TVar)(0.01 * fabs(exp))) );
        }
        else
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (Eigenvalues[eigen] - TVar(0.01)) );
        }
		
        /** Normalizing Initial Eigenvec */
        REAL norm1 = 0.;
        for(int64_t i = 0; i < size; i++) norm1 += fabs(VecIni(i,0)) * fabs(VecIni(i,0)); norm1 = sqrt(norm1);
        for(int64_t i = 0; i < size; i++) VecIni(i,0) = VecIni(i,0)/(TVar)norm1;
		
        int64_t count = 0;
        double dif = 10., difTemp = 0.;
		
        while(dif > tolerance && count <= NumIt)
        {
			for(int64_t i = 0; i < size; i++) VecIni_cp(i,0) = VecIni(i,0);
			
			/** Estimating Eigenvec */
			Matrix.Solve_LU(&VecIni);
			
			/** Normalizing Final Eigenvec */
			REAL norm2 = 0.;
			for(int64_t i = 0; i < size; i++) norm2 += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
			norm2 = sqrt(norm2);
			
			difTemp = 0.;
			for(int64_t i = 0; i < size; i++)
			{
                VecIni(i,0) = VecIni(i,0)/(TVar)norm2;
                TVar exp = (VecIni_cp(i,0) - VecIni(i,0)) * (VecIni_cp(i,0) - VecIni(i,0));
                difTemp += fabs(exp);
			}
			dif = sqrt(difTemp);
			count++;
        }
		
        /** Copy values from AuxVector to Eigenvectors */
        for(int64_t i = 0; i < size; i++)
        {
			TVar val = VecIni(i,0);
			if((REAL)(fabs(val)) < 1.E-5) val = 0.;
			Eigenvectors(eigen,i) = val;
        }
		
#ifdef PZDEBUG2
        double norm = 0.;
        for(int64_t i = 0; i < size; i++) norm += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
        if (fabs(norm - 1.) > 1.e-10)
        {
            PZError << __PRETTY_FUNCTION__ << endl;
        }
        if(count > NumIt-1)// O metodo nao convergiu !!!
        {
            PZError << __PRETTY_FUNCTION__ << endl;
#ifdef PZ_LOG
            {
                std::stringstream sout;
                Print("Matrix for SolveEigensystemJacobi did not converge",sout);
                LOGPZ_DEBUG(logger,sout.str());
            }
#endif
        }
#endif
	}
	
	return true;
	
}